

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O2

string * __thiscall POSG::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,POSG *this)

{
  double *pdVar1;
  pointer prVar2;
  ostream *poVar3;
  double *pdVar4;
  pointer prVar5;
  stringstream ss_1;
  stringstream ss_2;
  stringstream ss;
  string local_508 [32];
  string local_4e8 [32];
  stringstream local_4c8 [16];
  ostream local_4b8 [376];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar3 = std::operator<<(local_1a8,"Discount factors: ");
  std::__cxx11::stringstream::stringstream(local_4c8);
  pdVar4 = (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::operator<<(local_4b8,"< ");
  for (; pdVar4 != pdVar1; pdVar4 = pdVar4 + 1) {
    if (pdVar4 != (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      std::operator<<(local_4b8,", ");
    }
    std::__cxx11::stringstream::stringstream(local_340);
    std::ostream::_M_insert<double>(*pdVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_340);
    std::operator<<(local_4b8,local_4e8);
    std::__cxx11::string::~string(local_4e8);
  }
  std::operator<<(local_4b8," >");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_4c8);
  poVar3 = std::operator<<(poVar3,local_508);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_508);
  poVar3 = std::operator<<(local_1a8,"Reward type: ");
  std::__cxx11::stringstream::stringstream(local_4c8);
  prVar5 = (this->_m_rewardType).
           super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  prVar2 = (this->_m_rewardType).
           super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::operator<<(local_4b8,"< ");
  for (; prVar5 != prVar2; prVar5 = prVar5 + 1) {
    if (prVar5 != (this->_m_rewardType).
                  super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      std::operator<<(local_4b8,", ");
    }
    std::__cxx11::stringstream::stringstream(local_340);
    std::ostream::operator<<(local_330,*prVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_340);
    std::operator<<(local_4b8,local_4e8);
    std::__cxx11::string::~string(local_4e8);
  }
  std::operator<<(local_4b8," >");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_4c8);
  poVar3 = std::operator<<(poVar3,local_508);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_508);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string POSG::SoftPrint() const
{
    stringstream ss;
    ss << "Discount factors: " << 
        PrintTools::SoftPrintVector(_m_discount) << endl;
    ss << "Reward type: " << 
        PrintTools::SoftPrintVector(_m_rewardType) << endl;
    return ss.str();
}